

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkDepthClampRangeEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkDepthClampRangeEXT>
          (Impl *this,VkDepthClampRangeEXT *src,size_t count,ScratchAllocator *alloc)

{
  VkDepthClampRangeEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkDepthClampRangeEXT>(alloc,count);
    if (pVVar1 != (VkDepthClampRangeEXT *)0x0) {
      pVVar1 = (VkDepthClampRangeEXT *)memmove(pVVar1,src,count << 3);
      return pVVar1;
    }
  }
  return (VkDepthClampRangeEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}